

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::Speed> metaf::Speed::fromString(string *s,Unit unit)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  optional<metaf::Speed> oVar7;
  
  uVar6 = 0x100000000;
  if (s->_M_string_length == 0) {
LAB_001a6dde:
    uVar3 = 0x100000000;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 == 0) goto LAB_001a6dde;
    uVar3 = s->_M_string_length;
    if (uVar3 == 3) {
      pcVar2 = (s->_M_dataplus)._M_p;
      if (*pcVar2 != '0') goto LAB_001a6dfd;
    }
    else if (uVar3 == 2) {
      pcVar2 = (s->_M_dataplus)._M_p;
LAB_001a6dfd:
      uVar5 = 0;
      uVar4 = 0;
      do {
        if (9 < (byte)(pcVar2[uVar5] - 0x30U)) goto LAB_001a6def;
        uVar4 = (uint)(byte)(pcVar2[uVar5] - 0x30U) + uVar4 * 10;
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) < uVar3);
      uVar3 = (ulong)unit | 0x100000000;
      uVar5 = (ulong)uVar4;
      goto LAB_001a6df4;
    }
LAB_001a6def:
    uVar3 = 0;
  }
  uVar5 = 0;
  uVar6 = 0;
LAB_001a6df4:
  oVar7.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._M_payload._0_8_ = uVar5 | uVar6;
  oVar7.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._8_8_ = uVar3;
  return (optional<metaf::Speed>)
         oVar7.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Speed>;
}

Assistant:

std::optional<Speed> Speed::fromString(const std::string & s, Unit unit) {
	//static const std::regex rgx ("([1-9]?\\d\\d)|//");
	static const std::optional<Speed> error;
	if (s.empty() || s == "//") return Speed();
	if (s.length() != 2 && s.length() != 3) return error;
	if (s.length() == 3 && s[0] == '0') return error;
	const auto spd = strToUint(s, 0, s.length());
	if (!spd.has_value()) return error;
	Speed speed;
	speed.speedUnit = unit;
	speed.speedValue = *spd;
	return speed;
}